

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&> *
__thiscall
testing::internal::
MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>::
operator=(MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
          *this,MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
                *other)

{
  MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
  *other_local;
  MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
  *this_local;
  
  if (this != other) {
    Destroy(this);
    this->vtable_ = other->vtable_;
    this->buffer_ = other->buffer_;
    other->vtable_ = (VTable *)0x0;
  }
  return this;
}

Assistant:

MatcherBase& operator=(MatcherBase&& other) {
    if (this == &other) return *this;
    Destroy();
    vtable_ = other.vtable_;
    buffer_ = other.buffer_;
    other.vtable_ = nullptr;
    return *this;
  }